

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::MultiAggregationPS::MultiAggregationPS
          (MultiAggregationPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *simplifier,int _i,int _j,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *constant,shared_ptr<soplex::Tolerances> *tols)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *__return_storage_ptr__;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  pointer pnVar6;
  Item *pIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  bool bVar12;
  cpp_dec_float<50U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_278;
  undefined **local_240;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_238;
  long local_230;
  element_type *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_228 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_220._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
    }
  }
  iVar3 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  iVar4 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_240 = &PTR__PostStep_003b3828;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b3828;
  (this->super_PostStep).m_name = "MultiAggregation";
  (this->super_PostStep).nCols = iVar4;
  (this->super_PostStep).nRows = iVar3;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_228;
  local_238 = simplifier;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_220);
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__MultiAggregationPS_003b42d8;
  this->m_j = _j;
  this->m_i = _i;
  this->m_old_j =
       (lp->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  this->m_old_i =
       (lp->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  local_230 = (long)_j;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8) =
       *(undefined8 *)(pnVar5[local_230].m_backend.data._M_elems + 8);
  uVar8 = *(undefined8 *)&pnVar5[local_230].m_backend.data;
  uVar9 = *(undefined8 *)(pnVar5[local_230].m_backend.data._M_elems + 2);
  puVar2 = pnVar5[local_230].m_backend.data._M_elems + 4;
  uVar10 = *(undefined8 *)(puVar2 + 2);
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 4) = *(undefined8 *)puVar2;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)(this->m_upper).m_backend.data._M_elems = uVar8;
  *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 2) = uVar9;
  (this->m_upper).m_backend.exp = pnVar5[local_230].m_backend.exp;
  (this->m_upper).m_backend.neg = pnVar5[local_230].m_backend.neg;
  iVar11 = pnVar5[local_230].m_backend.prec_elem;
  (this->m_upper).m_backend.fpclass = pnVar5[local_230].m_backend.fpclass;
  (this->m_upper).m_backend.prec_elem = iVar11;
  pnVar5 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8) =
       *(undefined8 *)(pnVar5[local_230].m_backend.data._M_elems + 8);
  uVar8 = *(undefined8 *)&pnVar5[local_230].m_backend.data;
  uVar9 = *(undefined8 *)(pnVar5[local_230].m_backend.data._M_elems + 2);
  puVar2 = pnVar5[local_230].m_backend.data._M_elems + 4;
  uVar10 = *(undefined8 *)(puVar2 + 2);
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 4) = *(undefined8 *)puVar2;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)(this->m_lower).m_backend.data._M_elems = uVar8;
  *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 2) = uVar9;
  (this->m_lower).m_backend.exp = pnVar5[local_230].m_backend.exp;
  (this->m_lower).m_backend.neg = pnVar5[local_230].m_backend.neg;
  iVar11 = pnVar5[local_230].m_backend.prec_elem;
  (this->m_lower).m_backend.fpclass = pnVar5[local_230].m_backend.fpclass;
  (this->m_lower).m_backend.prec_elem = iVar11;
  __return_storage_ptr__ = &this->m_obj;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(__return_storage_ptr__,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_278,lp,_j);
    *(ulong *)((this->m_obj).m_backend.data._M_elems + 8) =
         CONCAT35(local_278.data._M_elems[9]._1_3_,local_278.data._M_elems._32_5_);
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) = local_278.data._M_elems._16_8_;
    *(ulong *)((this->m_obj).m_backend.data._M_elems + 6) =
         CONCAT35(local_278.data._M_elems[7]._1_3_,local_278.data._M_elems._24_5_);
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_278.data._M_elems._0_8_
    ;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) = local_278.data._M_elems._8_8_;
    (this->m_obj).m_backend.exp = local_278.exp;
    (this->m_obj).m_backend.neg = local_278.neg;
    (this->m_obj).m_backend.fpclass = local_278.fpclass;
    (this->m_obj).m_backend.prec_elem = local_278.prec_elem;
    if (local_278.fpclass != cpp_dec_float_finite || (this->m_obj).m_backend.data._M_elems[0] != 0)
    {
      (this->m_obj).m_backend.neg = (bool)(local_278.neg ^ 1);
    }
  }
  *(undefined8 *)((this->m_const).m_backend.data._M_elems + 8) =
       *(undefined8 *)((constant->m_backend).data._M_elems + 8);
  uVar8 = *(undefined8 *)(constant->m_backend).data._M_elems;
  uVar9 = *(undefined8 *)((constant->m_backend).data._M_elems + 2);
  uVar10 = *(undefined8 *)((constant->m_backend).data._M_elems + 6);
  *(undefined8 *)((this->m_const).m_backend.data._M_elems + 4) =
       *(undefined8 *)((constant->m_backend).data._M_elems + 4);
  *(undefined8 *)((this->m_const).m_backend.data._M_elems + 6) = uVar10;
  *(undefined8 *)(this->m_const).m_backend.data._M_elems = uVar8;
  *(undefined8 *)((this->m_const).m_backend.data._M_elems + 2) = uVar9;
  local_218.m_backend.exp = (constant->m_backend).exp;
  (this->m_const).m_backend.exp = local_218.m_backend.exp;
  local_218.m_backend.neg = (constant->m_backend).neg;
  (this->m_const).m_backend.neg = local_218.m_backend.neg;
  local_218.m_backend.fpclass = (constant->m_backend).fpclass;
  (this->m_const).m_backend.fpclass = local_218.m_backend.fpclass;
  local_218.m_backend.prec_elem = (constant->m_backend).prec_elem;
  (this->m_const).m_backend.prec_elem = local_218.m_backend.prec_elem;
  local_218.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((constant->m_backend).data._M_elems + 8);
  local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(constant->m_backend).data._M_elems;
  local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)((constant->m_backend).data._M_elems + 2)
  ;
  local_218.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((constant->m_backend).data._M_elems + 4);
  local_218.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((constant->m_backend).data._M_elems + 6);
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_158.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar6[_i].m_backend.data._M_elems + 8)
  ;
  pnVar5 = pnVar6 + _i;
  local_158.m_backend.data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
  local_158.m_backend.data._M_elems[1] = (pnVar5->m_backend).data._M_elems[1];
  local_158.m_backend.data._M_elems[2] = (pnVar5->m_backend).data._M_elems[2];
  local_158.m_backend.data._M_elems[3] = (pnVar5->m_backend).data._M_elems[3];
  puVar2 = pnVar6[_i].m_backend.data._M_elems + 4;
  local_158.m_backend.data._M_elems[4] = *puVar2;
  local_158.m_backend.data._M_elems[5] = puVar2[1];
  local_158.m_backend.data._M_elems[6] = puVar2[2];
  local_158.m_backend.data._M_elems[7] = puVar2[3];
  local_158.m_backend.exp = pnVar6[_i].m_backend.exp;
  local_158.m_backend.neg = pnVar6[_i].m_backend.neg;
  local_158.m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  local_158.m_backend.prec_elem = pnVar6[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
  bVar12 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_218,&local_158,&local_68);
  this->m_onLhs = bVar12;
  pnVar5 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_198.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar5[_i].m_backend.data._M_elems + 8)
  ;
  local_198.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[_i].m_backend.data;
  local_198.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar5[_i].m_backend.data._M_elems + 2);
  puVar2 = pnVar5[_i].m_backend.data._M_elems + 4;
  local_198.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_198.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  local_198.m_backend.exp = pnVar5[_i].m_backend.exp;
  local_198.m_backend.neg = pnVar5[_i].m_backend.neg;
  local_198.m_backend.fpclass = pnVar5[_i].m_backend.fpclass;
  local_198.m_backend.prec_elem = pnVar5[_i].m_backend.prec_elem;
  pnVar6 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar6[_i].m_backend.data._M_elems + 8)
  ;
  pnVar5 = pnVar6 + _i;
  local_1d8.m_backend.data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
  local_1d8.m_backend.data._M_elems[1] = (pnVar5->m_backend).data._M_elems[1];
  local_1d8.m_backend.data._M_elems[2] = (pnVar5->m_backend).data._M_elems[2];
  local_1d8.m_backend.data._M_elems[3] = (pnVar5->m_backend).data._M_elems[3];
  puVar2 = pnVar6[_i].m_backend.data._M_elems + 4;
  local_1d8.m_backend.data._M_elems[4] = *puVar2;
  local_1d8.m_backend.data._M_elems[5] = puVar2[1];
  local_1d8.m_backend.data._M_elems[6] = puVar2[2];
  local_1d8.m_backend.data._M_elems[7] = puVar2[3];
  local_1d8.m_backend.exp = pnVar6[_i].m_backend.exp;
  local_1d8.m_backend.neg = pnVar6[_i].m_backend.neg;
  local_1d8.m_backend.fpclass = pnVar6[_i].m_backend.fpclass;
  local_1d8.m_backend.prec_elem = pnVar6[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
  bVar12 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_198,&local_1d8,&local_a0);
  this->m_eqCons = bVar12;
  pIVar7 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar3 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[_i].idx;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b2428;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             pIVar7[iVar3].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  this_00 = &(this->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(this_00,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)(pIVar7 + iVar3));
  pIVar7 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.theitem;
  iVar3 = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thekey[local_230].idx;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_col).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_col)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b2428;
  (this->m_col).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_col,
             pIVar7[iVar3].data.
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)(pIVar7 + iVar3));
  pnVar1 = &this->m_const;
  local_278.fpclass = cpp_dec_float_finite;
  local_278.prec_elem = 10;
  local_278.data._M_elems[0] = 0;
  local_278.data._M_elems[1] = 0;
  local_278.data._M_elems[2] = 0;
  local_278.data._M_elems[3] = 0;
  local_278.data._M_elems[4] = 0;
  local_278.data._M_elems[5] = 0;
  local_278.data._M_elems._24_5_ = 0;
  local_278.data._M_elems[7]._1_3_ = 0;
  local_278.data._M_elems._32_5_ = 0;
  local_278.data._M_elems[9]._1_3_ = 0;
  local_278.exp = 0;
  local_278.neg = false;
  v = &__return_storage_ptr__->m_backend;
  if ((&local_278 != &pnVar1->m_backend) &&
     (v = &pnVar1->m_backend, &local_278 != &__return_storage_ptr__->m_backend)) {
    uVar8 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
    local_278.data._M_elems._32_5_ = SUB85(uVar8,0);
    local_278.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_278.data._M_elems._0_8_ = *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems
    ;
    local_278.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
    local_278.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
    uVar8 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
    local_278.data._M_elems._24_5_ = SUB85(uVar8,0);
    local_278.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
    local_278.exp = (this->m_obj).m_backend.exp;
    local_278.neg = (this->m_obj).m_backend.neg;
    local_278.fpclass = (this->m_obj).m_backend.fpclass;
    local_278.prec_elem = (this->m_obj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_278,v);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_d8,this_00,this->m_j);
  local_118.fpclass = cpp_dec_float_finite;
  local_118.prec_elem = 10;
  local_118.data._M_elems[0] = 0;
  local_118.data._M_elems[1] = 0;
  local_118.data._M_elems[2] = 0;
  local_118.data._M_elems[3] = 0;
  local_118.data._M_elems[4] = 0;
  local_118.data._M_elems[5] = 0;
  local_118.data._M_elems._24_5_ = 0;
  local_118.data._M_elems[7]._1_3_ = 0;
  local_118.data._M_elems._32_5_ = 0;
  local_118._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_118,&local_278,&local_d8);
  (*(local_238->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxSimplifier[0x11])(local_238,&local_118);
  return;
}

Assistant:

MultiAggregationPS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _i, int _j,
                         R constant, std::shared_ptr<Tolerances> tols)
         : PostStep("MultiAggregation", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_upper(lp.upper(_j))
         , m_lower(lp.lower(_j))
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_const(constant)
         , m_onLhs(EQ(constant, lp.lhs(_i), this->epsilon()))
         , m_eqCons(EQ(lp.lhs(_i), lp.rhs(_i), this->epsilon()))
         , m_row(lp.rowVector(_i))
         , m_col(lp.colVector(_j))
      {
         assert(m_row[m_j] != 0.0);
         simplifier.addObjoffset(m_obj * m_const / m_row[m_j]);
      }